

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O2

type __thiscall obs::signal<int_()>::operator()<>(signal<int_()> *this)

{
  bool bVar1;
  int iVar2;
  slot<int_()> *this_00;
  iterator __end0;
  iterator __begin0;
  iterator iStack_68;
  iterator local_40;
  
  safe_list<obs::slot<int_()>_>::begin(&local_40,&this->m_slots);
  safe_list<obs::slot<int_()>_>::end(&iStack_68,&this->m_slots);
  iVar2 = 0;
  while( true ) {
    bVar1 = safe_list<obs::slot<int_()>_>::iterator::operator!=(&local_40,&iStack_68);
    if (!bVar1) break;
    this_00 = safe_list<obs::slot<int_()>_>::iterator::operator*(&local_40);
    if (this_00 != (slot<int_()> *)0x0) {
      iVar2 = slot<int_()>::operator()<>(this_00);
    }
    safe_list<obs::slot<int_()>_>::iterator::operator++(&local_40);
  }
  safe_list<obs::slot<int_()>_>::iterator::~iterator(&iStack_68);
  safe_list<obs::slot<int_()>_>::iterator::~iterator(&local_40);
  return iVar2;
}

Assistant:

typename std::enable_if<!std::is_void<R>::value, R>::type
  operator()(Args2&&...args) {
    R result = R();
    for (auto slot : m_slots)
      if (slot)
        result = (*slot)(std::forward<Args2>(args)...);
    return result;
  }